

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  long lVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer piVar5;
  bool bVar6;
  string_view source_file;
  bool bVar7;
  uint uVar8;
  long lVar9;
  undefined7 uVar11;
  Logger *pLVar10;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long in_FS_OFFSET;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  string_view str;
  string_view logging_function;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 local_1a0;
  uint local_19c;
  double local_160;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double adStack_f0 [2];
  int confTarget_local;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = this->buckets;
  uVar12 = this->scale;
  pvVar3 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1a0 = 0;
  uVar19 = (int)((ulong)((long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3) - 1;
  local_118 = -1.0;
  dStack_110 = -1.0;
  dVar28 = 0.0;
  dVar30 = 0.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_f8 = 0.0;
  adStack_f0[0] = 0.0;
  local_148 = -1.0;
  dStack_140 = -1.0;
  local_138 = 0.0;
  dStack_130 = 0.0;
  local_128 = 0.0;
  dStack_120 = 0.0;
  dVar25 = 0.0;
  uVar20 = uVar19;
  local_19c = uVar19;
  if ((int)uVar19 < 0) {
    bVar16 = 1;
    dVar23 = 0.0;
    dVar26 = 0.0;
    uVar12 = uVar19;
  }
  else {
    lVar9 = (long)(int)(((confTarget + uVar12) - 1) / uVar12);
    pvVar4 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (int)((ulong)((long)(this->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) >> 3) *
             uVar12 * -0x55555555;
    piVar5 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar7 = true;
    dVar23 = 0.0;
    iVar13 = 0;
    dVar26 = 0.0;
    local_1a0 = 0;
    in_stack_fffffffffffffe58 = (undefined4)CONCAT71((int7)((ulong)piVar5 >> 8),1);
    uVar18 = (ulong)uVar19;
    do {
      uVar17 = (uint)uVar18;
      if (bVar7) {
        bVar7 = false;
        uVar20 = uVar17;
      }
      dVar31 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18];
      dVar24 = dVar23 + *(double *)
                         (*(long *)&(this->failAvg).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar9 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar18 * 8);
      uVar14 = nBlockHeight - confTarget;
      iVar15 = uVar12 - confTarget;
      if ((uint)confTarget < uVar12) {
        do {
          iVar13 = iVar13 + *(int *)(*(long *)&pvVar3[(ulong)uVar14 %
                                                      (ulong)(uint)((int)((ulong)((long)(this->
                                                  unconfTxs).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pvVar3) >> 3) * -0x55555555)].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + uVar18 * 4);
          uVar14 = uVar14 - 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      dVar26 = dVar26 + dVar31;
      dVar29 = dVar28 + *(double *)
                         (*(long *)&pvVar4[lVar9 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar18 * 8);
      dVar31 = dVar30 + dVar31;
      iVar13 = iVar13 + piVar5[uVar18];
      dVar23 = dVar24;
      dVar28 = dVar29;
      dVar30 = dVar31;
      if (sufficientTxVal / (1.0 - this->decay) <= dVar26) {
        dVar27 = (double)iVar13;
        if (successBreakPoint <= dVar29 / (dVar31 + dVar24 + dVar27)) {
          local_128 = 0.0;
          dStack_120 = 0.0;
          local_138 = 0.0;
          dStack_130 = 0.0;
          local_148 = -1.0;
          dStack_140 = -1.0;
          dVar28 = 0.0;
          dVar30 = 0.0;
          iVar13 = 0;
          dVar26 = 0.0;
          uVar11 = (undefined7)((ulong)&local_138 >> 8);
          in_stack_fffffffffffffe58 = (undefined4)CONCAT71(uVar11,1);
          bVar7 = true;
          local_1a0 = (undefined4)CONCAT71(uVar11,1);
          dVar23 = 0.0;
          uVar19 = uVar17;
          local_19c = uVar20;
          local_108 = dVar29;
          dStack_100 = dVar31;
          local_f8 = dVar27;
          adStack_f0[0] = dVar24;
        }
        else {
          dVar26 = 0.0;
          if ((char)in_stack_fffffffffffffe58 != '\0') {
            uVar8 = uVar17;
            uVar14 = uVar20;
            if (uVar17 < uVar20) {
              uVar8 = uVar20;
              uVar14 = uVar17;
            }
            local_148 = 0.0;
            if (uVar14 != 0) {
              local_148 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar14 - 1];
            }
            dStack_140 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
            in_stack_fffffffffffffe58 = 0;
            local_138 = dVar29;
            dStack_130 = dVar31;
            local_128 = dVar27;
            dStack_120 = dVar24;
          }
        }
      }
      bVar6 = 0 < (long)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar6);
    dVar26 = (double)iVar13;
    bVar16 = (byte)in_stack_fffffffffffffe58 ^ 1 | bVar7;
    uVar12 = 0;
  }
  median = -1.0;
  uVar17 = uVar19;
  if (uVar19 < local_19c) {
    uVar17 = local_19c;
    local_19c = uVar19;
  }
  uVar19 = local_19c;
  do {
    dVar25 = dVar25 + (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19];
    uVar19 = uVar19 + 1;
  } while (uVar19 <= uVar17);
  if (((byte)local_1a0 & dVar25 != 0.0) != 0) {
    dVar25 = dVar25 * 0.5;
    uVar19 = local_19c;
    do {
      dVar31 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      if (dVar25 <= dVar31) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19] / dVar31;
        break;
      }
      dVar25 = dVar25 - dVar31;
      uVar19 = uVar19 + 1;
    } while (uVar19 <= uVar17);
    if (local_19c == 0) {
      uVar21 = 0;
      uVar22 = 0;
    }
    else {
      dVar25 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_19c - 1];
      uVar21 = SUB84(dVar25,0);
      uVar22 = (undefined4)((ulong)dVar25 >> 0x20);
    }
    local_118 = (double)CONCAT44(uVar22,uVar21);
    dStack_110 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
  }
  if (bVar16 == 0) {
    uVar19 = uVar12;
    if (uVar12 < uVar20) {
      uVar19 = uVar20;
      uVar20 = uVar12;
    }
    if (uVar20 == 0) {
      uVar21 = 0;
      uVar22 = 0;
    }
    else {
      dVar25 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar20 - 1];
      uVar21 = SUB84(dVar25,0);
      uVar22 = (undefined4)((ulong)dVar25 >> 0x20);
    }
    local_148 = (double)CONCAT44(uVar22,uVar21);
    dStack_140 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar19];
    local_138 = dVar28;
    dStack_130 = dVar30;
    local_128 = dVar26;
    dStack_120 = dVar23;
  }
  passed_within_target_perc = 0.0;
  dVar25 = dStack_100 + local_f8 + adStack_f0[0];
  failed_within_target_perc = 0.0;
  if ((dVar25 != 0.0) || (NAN(dVar25))) {
    passed_within_target_perc = (float)((local_108 * 100.0) / dVar25);
  }
  dVar25 = dStack_130 + local_128 + dStack_120;
  if ((dVar25 != 0.0) || (NAN(dVar25))) {
    failed_within_target_perc = (float)((local_138 * 100.0) / dVar25);
  }
  confTarget_local = confTarget;
  pLVar10 = LogInstance();
  bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar10,ESTIMATEFEE,Debug);
  if (bVar7) {
    local_160 = successBreakPoint * 100.0;
    pLVar10 = LogInstance();
    bVar7 = BCLog::Logger::Enabled(pLVar10);
    if (bVar7) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::
      format<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
                (&local_78,
                 (tinyformat *)
                 "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n"
                 ,(char *)&confTarget_local,(int *)&local_160,&this->decay,&median,&local_118,
                 &dStack_110,(double *)&passed_within_target_perc,(float *)&local_108,&dStack_100,
                 &local_f8,adStack_f0,&local_148,&dStack_140,(double *)&failed_within_target_perc,
                 (float *)&local_138,&dStack_130,&local_128,&dStack_120,
                 (double *)CONCAT44(local_1a0,in_stack_fffffffffffffe58));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar10 = LogInstance();
      local_78._M_dataplus._M_p = &DAT_00000058;
      local_78._M_string_length = 0xfe4ab7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "EstimateMedianVal";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar10,str,logging_function,source_file,0x18b,ESTIMATEFEE,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
        operator_delete(log_msg._M_dataplus._M_p,
                        CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                 log_msg.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_f8;
    (result->pass).leftMempool = adStack_f0[0];
    (result->pass).withinTarget = local_108;
    (result->pass).totalConfirmed = dStack_100;
    (result->pass).start = local_118;
    (result->pass).end = dStack_110;
    (result->fail).start = local_148;
    (result->fail).end = dStack_140;
    (result->fail).withinTarget = local_138;
    (result->fail).totalConfirmed = dStack_130;
    (result->fail).inMempool = local_128;
    (result->fail).leftMempool = dStack_120;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return median;
  }
  __stack_chk_fail();
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}